

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

object __thiscall pybind11::cpp_function::name(cpp_function *this)

{
  PyObject *pPVar1;
  object *poVar2;
  undefined8 *in_RSI;
  accessor<pybind11::detail::accessor_policies::str_attr> local_30;
  
  local_30.obj.m_ptr = (PyObject *)*in_RSI;
  local_30.key = "__name__";
  local_30.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
  poVar2 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(&local_30);
  pPVar1 = (poVar2->super_handle).m_ptr;
  (this->super_function).super_object.super_handle.m_ptr = pPVar1;
  if (pPVar1 != (PyObject *)0x0) {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
  }
  object::~object(&local_30.cache);
  return (object)(handle)this;
}

Assistant:

object name() const { return attr("__name__"); }